

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall caffe::LayerParameter::LayerParameter(LayerParameter *this)

{
  LayerParameter *pLVar1;
  LayerParameter *this_local;
  
  google::protobuf::Message::Message(&this->super_Message);
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__LayerParameter_00d4e0c0;
  google::protobuf::internal::InternalMetadataWithArena::InternalMetadataWithArena
            (&this->_internal_metadata_,(Arena *)0x0);
  memset(&this->_has_bits_,0,8);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::RepeatedPtrField(&this->bottom_);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::RepeatedPtrField(&this->top_);
  google::protobuf::RepeatedField<float>::RepeatedField(&this->loss_weight_);
  google::protobuf::RepeatedPtrField<caffe::ParamSpec>::RepeatedPtrField(&this->param_);
  google::protobuf::RepeatedPtrField<caffe::BlobProto>::RepeatedPtrField(&this->blobs_);
  google::protobuf::RepeatedPtrField<caffe::NetStateRule>::RepeatedPtrField(&this->include_);
  google::protobuf::RepeatedPtrField<caffe::NetStateRule>::RepeatedPtrField(&this->exclude_);
  google::protobuf::RepeatedField<bool>::RepeatedField(&this->propagate_down_);
  pLVar1 = internal_default_instance();
  if (this != pLVar1) {
    protobuf_caffe_2eproto::InitDefaults();
  }
  SharedCtor(this);
  return;
}

Assistant:

LayerParameter::LayerParameter()
  : ::google::protobuf::Message(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_caffe_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:caffe.LayerParameter)
}